

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O3

void png_format_buffer(png_const_structrp png_ptr,png_charp buffer,png_const_charp error_message)

{
  int iVar1;
  int iVar2;
  png_charp pcVar3;
  long lVar4;
  uint uVar5;
  
  iVar2 = 0x18;
  iVar1 = 0;
  do {
    uVar5 = (uint)png_ptr >> ((byte)iVar2 & 0x1f);
    if ((uVar5 & 0xff) - 0x5b < 6 || (uVar5 & 0xff) - 0x7b < 0xffffffc6) {
      buffer[iVar1] = '[';
      buffer[(long)iVar1 + 1] = "0123456789ABCDEF"[uVar5 >> 4 & 0xf];
      buffer[(long)iVar1 + 2] = "0123456789ABCDEF"[uVar5 & 0xf];
      buffer[(long)iVar1 + 3] = ']';
      iVar1 = iVar1 + 4;
    }
    else {
      buffer[iVar1] = (char)uVar5;
      iVar1 = iVar1 + 1;
    }
    iVar2 = iVar2 + -8;
  } while (iVar2 != -8);
  pcVar3 = buffer + iVar1;
  if (error_message != (png_const_charp)0x0) {
    pcVar3[0] = ':';
    pcVar3[1] = ' ';
    iVar2 = iVar1 + 0xc5;
    lVar4 = 0;
    do {
      if (error_message[lVar4] == '\0') {
        iVar2 = iVar1 + 2 + (int)lVar4;
        break;
      }
      buffer[lVar4 + (iVar1 + 2)] = error_message[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0xc3);
    pcVar3 = buffer + iVar2;
  }
  *pcVar3 = '\0';
  return;
}

Assistant:

static void /* PRIVATE */
png_format_buffer(png_const_structrp png_ptr, png_charp buffer, png_const_charp
    error_message)
{
   png_uint_32 chunk_name = png_ptr->chunk_name;
   int iout = 0, ishift = 24;

   while (ishift >= 0)
   {
      int c = (int)(chunk_name >> ishift) & 0xff;

      ishift -= 8;
      if (isnonalpha(c) != 0)
      {
         buffer[iout++] = PNG_LITERAL_LEFT_SQUARE_BRACKET;
         buffer[iout++] = png_digit[(c & 0xf0) >> 4];
         buffer[iout++] = png_digit[c & 0x0f];
         buffer[iout++] = PNG_LITERAL_RIGHT_SQUARE_BRACKET;
      }

      else
      {
         buffer[iout++] = (char)c;
      }
   }

   if (error_message == NULL)
      buffer[iout] = '\0';

   else
   {
      int iin = 0;

      buffer[iout++] = ':';
      buffer[iout++] = ' ';

      while (iin < PNG_MAX_ERROR_TEXT-1 && error_message[iin] != '\0')
         buffer[iout++] = error_message[iin++];

      /* iin < PNG_MAX_ERROR_TEXT, so the following is safe: */
      buffer[iout] = '\0';
   }
}